

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.hpp
# Opt level: O0

pair<std::shared_ptr<unsigned_long>,_pstore::typed_address<unsigned_long>_> * __thiscall
pstore::transaction_base::alloc_rw<unsigned_long,void>
          (pair<std::shared_ptr<unsigned_long>,_pstore::typed_address<unsigned_long>_>
           *__return_storage_ptr__,transaction_base *this,size_t num)

{
  typed_address<unsigned_long> local_50;
  shared_ptr<unsigned_long> local_48;
  undefined1 local_38 [8];
  pair<std::shared_ptr<void>,_pstore::address> result;
  size_t num_local;
  transaction_base *this_local;
  
  result.second.a_ = num;
  alloc_rw((pair<std::shared_ptr<void>,_pstore::address> *)local_38,this,num << 3,8);
  std::static_pointer_cast<unsigned_long,void>((shared_ptr<void> *)&local_48);
  typed_address<unsigned_long>::typed_address
            (&local_50,
             (address)result.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi);
  std::pair<std::shared_ptr<unsigned_long>,_pstore::typed_address<unsigned_long>_>::
  pair<std::shared_ptr<unsigned_long>,_pstore::typed_address<unsigned_long>,_true>
            (__return_storage_ptr__,&local_48,&local_50);
  std::shared_ptr<unsigned_long>::~shared_ptr(&local_48);
  std::pair<std::shared_ptr<void>,_pstore::address>::~pair
            ((pair<std::shared_ptr<void>,_pstore::address> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

auto alloc_rw (std::size_t const num = 1)
            -> std::pair<std::shared_ptr<Ty>, typed_address<Ty>> {
            auto result = this->alloc_rw (sizeof (Ty) * num, alignof (Ty));
            return {std::static_pointer_cast<Ty> (result.first), typed_address<Ty> (result.second)};
        }